

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall xemmai::t_parser::operator()(t_parser *this,t_scope *a_scope)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer *ppptVar3;
  t_object *ptVar4;
  t_scope *ptVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> *p_Var8;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> *p_Var9;
  pointer pptVar10;
  _Alloc_hider _Var11;
  iterator __position;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> *p_Var12;
  tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> in_RAX;
  _Rb_tree_node_base *p_Var13;
  wchar_t *pwVar14;
  _Base_ptr p_Var15;
  pointer *__ptr;
  _Base_ptr p_Var16;
  iterator __end1;
  wstring_view a_message;
  t_variable *p;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> local_38;
  
  this->v_scope = a_scope;
  pwVar14 = (this->v_lexer).v_indent.v_i;
  ptVar4 = (this->v_lexer).v_indent.v_p;
  local_38._M_head_impl =
       (t_node *)
       in_RAX.
       super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
       super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  while( true ) {
    ptVar5 = this->v_scope;
    if ((this->v_lexer).v_token == c_token__EOF) {
      p_Var13 = (ptVar5->v_unresolveds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(ptVar5->v_unresolveds)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var13 != p_Var1) {
        p_Var6 = (ptVar5->v_variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var2 = &(ptVar5->v_variables)._M_t._M_impl.super__Rb_tree_header;
        do {
          uVar7 = *(ulong *)(p_Var13 + 1);
          p_Var16 = p_Var6;
          p_Var15 = &p_Var2->_M_header;
          for (; p_Var16 != (_Base_ptr)0x0;
              p_Var16 = (&p_Var16->_M_left)[*(ulong *)(p_Var16 + 1) < uVar7]) {
            if (*(ulong *)(p_Var16 + 1) >= uVar7) {
              p_Var15 = p_Var16;
            }
          }
          p_Var16 = &p_Var2->_M_header;
          if (((_Rb_tree_header *)p_Var15 != p_Var2) &&
             (p_Var16 = p_Var15, uVar7 < *(ulong *)(p_Var15 + 1))) {
            p_Var16 = &p_Var2->_M_header;
          }
          if ((_Rb_tree_header *)p_Var16 != p_Var2) {
            *(undefined1 *)&p_Var16[1]._M_parent = 1;
          }
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
        } while ((_Rb_tree_header *)p_Var13 != p_Var1);
      }
      p_Var8 = (_Head_base<0UL,_xemmai::ast::t_node_*,_false> *)
               (ptVar5->v_privates).
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var9 = (_Head_base<0UL,_xemmai::ast::t_node_*,_false> *)
               (ptVar5->v_privates).
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pptVar10 = (ptVar5->v_privates).
                 super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (ptVar5->v_privates).
      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (ptVar5->v_privates).
      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (ptVar5->v_privates).
      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var12 = p_Var8;
      if (ptVar5->v_self_shared != false) {
        ptVar5->v_shareds = ptVar5->v_shareds + 1;
      }
      for (; p_Var12 != p_Var9; p_Var12 = p_Var12 + 1) {
        local_38._M_head_impl = p_Var12->_M_head_impl;
        ptVar5 = this->v_scope;
        if (*(char *)&(local_38._M_head_impl)->_vptr_t_node == '\x01') {
          _Var11._M_p = (pointer)ptVar5->v_shareds;
          ptVar5->v_shareds = (long)_Var11._M_p + 1;
          (((wstring *)&(local_38._M_head_impl)->v_at)->_M_dataplus)._M_p = _Var11._M_p;
        }
        else {
          __position._M_current =
               (ptVar5->v_privates).
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (((wstring *)&(local_38._M_head_impl)->v_at)->_M_dataplus)._M_p =
               (pointer)((long)__position._M_current -
                         (long)(ptVar5->v_privates).
                               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3);
          if (__position._M_current ==
              (ptVar5->v_privates).
              super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>::
            _M_realloc_insert<xemmai::t_code::t_variable*const&>
                      ((vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>
                        *)&ptVar5->v_privates,__position,(t_variable **)&stack0xffffffffffffffc8);
          }
          else {
            *__position._M_current = (t_variable *)local_38._M_head_impl;
            ppptVar3 = &(ptVar5->v_privates).
                        super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *ppptVar3 = *ppptVar3 + 1;
          }
        }
      }
      if (p_Var8 != (_Head_base<0UL,_xemmai::ast::t_node_*,_false> *)0x0) {
        operator_delete(p_Var8,(long)pptVar10 - (long)p_Var8);
      }
      return;
    }
    f_expression((t_parser *)&stack0xffffffffffffffc8);
    std::
    vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
    ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                *)&ptVar5->v_block,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               &stack0xffffffffffffffc8);
    if ((t_script *)local_38._M_head_impl != (t_script *)0x0) {
      (*((t_body *)&(local_38._M_head_impl)->_vptr_t_node)->_vptr_t_body[1])();
    }
    if ((this->v_lexer).v_newline == false) break;
    if ((long)(this->v_lexer).v_indent.v_i + (-0x50 - (long)(this->v_lexer).v_indent.v_p) !=
        (long)pwVar14 + (-0x50 - (long)ptVar4)) {
      pwVar14 = L"unexpected indent.";
LAB_0016c190:
      a_message._M_str = pwVar14;
      a_message._M_len = 0x12;
      f_throw(this,a_message);
    }
  }
  pwVar14 = L"expecting newline.";
  goto LAB_0016c190;
}

Assistant:

void t_parser::operator()(ast::t_scope& a_scope)
{
	v_scope = &a_scope;
	size_t indent = v_lexer.f_indent();
	while (v_lexer.f_token() != t_lexer::c_token__EOF) {
		v_scope->v_block.push_back(f_expression());
		if (!v_lexer.f_newline()) f_throw(L"expecting newline."sv);
		if (v_lexer.f_indent() != indent) f_throw(L"unexpected indent."sv);
	}
	for (auto symbol : v_scope->v_unresolveds) {
		auto i = v_scope->v_variables.find(symbol);
		if (i != v_scope->v_variables.end()) i->second.v_shared = true;
	}
	std::vector<t_code::t_variable*> variables;
	variables.swap(v_scope->v_privates);
	if (v_scope->v_self_shared) ++v_scope->v_shareds;
	for (auto p : variables) {
		if (p->v_shared) {
			p->v_index = v_scope->v_shareds++;
		} else {
			p->v_index = v_scope->v_privates.size();
			v_scope->v_privates.push_back(p);
		}
	}
}